

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O0

void __thiscall Test::TextOutput::printFailure(TextOutput *this,Assertion *assertion)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  string local_70;
  byte local_3a;
  allocator<char> local_39;
  string local_38 [32];
  Assertion *local_18;
  Assertion *assertion_local;
  TextOutput *this_local;
  
  local_18 = assertion;
  assertion_local = (Assertion *)this;
  poVar2 = std::operator<<(this->stream,"Test \'");
  poVar2 = std::operator<<(poVar2,(string *)&local_18->method);
  poVar2 = std::operator<<(poVar2,'(');
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_18->args);
  local_3a = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string(local_38,"",&local_39);
  }
  else {
    std::__cxx11::string::string(local_38,&local_18->args);
  }
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,")\' failed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  poVar2 = std::operator<<(this->stream,"\tSuite: ");
  poVar2 = std::operator<<(poVar2,(string *)local_18);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(this->stream,"\tFile: ");
  Private::getFileName(&local_70,&local_18->file);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = std::operator<<(this->stream,"\tLine: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,local_18->lineNumber);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_18->errorMessage);
  if (!bVar1) {
    poVar2 = std::operator<<(this->stream,"\tFailure: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_18->errorMessage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_18->userMessage);
  if (!bVar1) {
    poVar2 = std::operator<<(this->stream,"\tMessage: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_18->userMessage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TextOutput::printFailure(const Assertion &assertion) {
  stream << "Test '" << assertion.method << '(' << (assertion.args.empty() ? "" : assertion.args) << ")' failed!"
         << std::endl;
  stream << "\tSuite: " << assertion.suite << std::endl;
  stream << "\tFile: " << Private::getFileName(assertion.file) << std::endl;
  stream << "\tLine: " << assertion.lineNumber << std::endl;
  if (!assertion.errorMessage.empty())
    stream << "\tFailure: " << assertion.errorMessage << std::endl;
  if (!assertion.userMessage.empty())
    stream << "\tMessage: " << assertion.userMessage << std::endl;
}